

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O1

void absl::lts_20240722::internal_any_invocable::
     LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
               (TypeErasedState *state,ForwardedParameterType<google::protobuf::io::Printer_*> args)

{
  Options *in_RCX;
  anon_class_1_0_00000001 local_109;
  string local_108;
  string local_e8;
  Sub local_c8;
  
  local_e8.field_2._M_allocated_capacity._0_4_ = 0x6e6970;
  local_e8._M_string_length = 3;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  google::protobuf::compiler::cpp::StrongReferenceToType_abi_cxx11_
            (&local_108,(cpp *)(state->remote).size,
             (Descriptor *)((long)(state->remote).target + 0x58),in_RCX);
  google::protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_c8,&local_e8,&local_108);
  google::protobuf::io::Printer::Emit
            (args,&local_c8,1,0x2e,"\n                    $pin$,\n                  ");
  if (local_c8.annotation_.
      super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload
      .super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
      true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               &local_c8.annotation_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.value_.consume_after._M_dataplus._M_p != &local_c8.value_.consume_after.field_2) {
    operator_delete(local_c8.value_.consume_after._M_dataplus._M_p,
                    local_c8.value_.consume_after.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr
    [local_c8.value_.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     _M_index]._M_data)(&local_109,&local_c8.value_.value);
  local_c8.value_.value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index =
       0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.key_._M_dataplus._M_p != &local_c8.key_.field_2) {
    operator_delete(local_c8.key_._M_dataplus._M_p,local_c8.key_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                             local_e8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return;
}

Assistant:

ReturnType LocalInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(
      IsStoredLocally<RawT>::value,
      "Target object must be in local storage in order to be invoked from it.");

  auto& f = (ObjectInLocalStorage<RawT>)(state);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}